

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

char * RTMath::display(char *label,RTMatrix4x4 *mat)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  RTFLOAT RVar7;
  RTFLOAT RVar8;
  RTFLOAT RVar9;
  RTFLOAT RVar10;
  RTFLOAT RVar11;
  RTFLOAT RVar12;
  RTFLOAT RVar13;
  RTFLOAT RVar14;
  RTFLOAT RVar15;
  RTFLOAT RVar16;
  RTMatrix4x4 *mat_local;
  char *label_local;
  
  RVar1 = RTMatrix4x4::val(mat,0,0);
  RVar2 = RTMatrix4x4::val(mat,0,1);
  RVar3 = RTMatrix4x4::val(mat,0,2);
  RVar4 = RTMatrix4x4::val(mat,0,3);
  RVar5 = RTMatrix4x4::val(mat,1,0);
  RVar6 = RTMatrix4x4::val(mat,1,1);
  RVar7 = RTMatrix4x4::val(mat,1,2);
  RVar8 = RTMatrix4x4::val(mat,1,3);
  RVar9 = RTMatrix4x4::val(mat,2,0);
  RVar10 = RTMatrix4x4::val(mat,2,1);
  RVar11 = RTMatrix4x4::val(mat,2,2);
  RVar12 = RTMatrix4x4::val(mat,2,3);
  RVar13 = RTMatrix4x4::val(mat,3,0);
  RVar14 = RTMatrix4x4::val(mat,3,1);
  RVar15 = RTMatrix4x4::val(mat,3,2);
  RVar16 = RTMatrix4x4::val(mat,3,3);
  sprintf(m_string,
          "%s(0): %f %f %f %f\n%s(1): %f %f %f %f\n%s(2): %f %f %f %f\n%s(3): %f %f %f %f\n",
          (double)RVar1,(double)RVar2,(double)RVar3,(double)RVar4,(double)RVar5,(double)RVar6,
          (double)RVar7,(double)RVar8,label,label,label,label,(double)RVar9,(double)RVar10,
          (double)RVar11,(double)RVar12,(double)RVar13,(double)RVar14,(double)RVar15,(double)RVar16)
  ;
  return m_string;
}

Assistant:

const char *RTMath::display(const char *label, RTMatrix4x4& mat)
{
    sprintf(m_string, "%s(0): %f %f %f %f\n%s(1): %f %f %f %f\n%s(2): %f %f %f %f\n%s(3): %f %f %f %f\n",
            label, mat.val(0,0), mat.val(0,1), mat.val(0,2), mat.val(0,3),
            label, mat.val(1,0), mat.val(1,1), mat.val(1,2), mat.val(1,3),
            label, mat.val(2,0), mat.val(2,1), mat.val(2,2), mat.val(2,3),
            label, mat.val(3,0), mat.val(3,1), mat.val(3,2), mat.val(3,3));
    return m_string;
}